

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

int32_t __thiscall icu_63::Package::findNextItem(Package *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *__s1;
  char *__s1_00;
  char *__s;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  Item *pIVar12;
  
  uVar1 = this->findNextIndex;
  uVar9 = (ulong)uVar1;
  if (-1 < (int)uVar1) {
    uVar2 = this->itemCount;
    if ((int)uVar1 < (int)uVar2) {
      iVar3 = this->findPrefixLength;
      uVar1 = this->findSuffixLength;
      __s1 = this->findPrefix;
      __s1_00 = this->findSuffix;
      uVar4 = this->matchMode;
      pIVar12 = this->items + uVar9;
      do {
        iVar11 = (int)uVar9;
        uVar8 = iVar11 + 1;
        uVar9 = (ulong)uVar8;
        this->findNextIndex = uVar8;
        __s = pIVar12->name;
        sVar6 = strlen(__s);
        iVar10 = (int)sVar6;
        if ((int)(iVar3 + uVar1) <= iVar10) {
          if ((0 < iVar3) && (iVar5 = bcmp(__s1,__s,(long)iVar3), iVar5 != 0)) break;
          if (((int)uVar1 < 1) ||
             (iVar5 = bcmp(__s1_00,__s + (int)(iVar10 - uVar1),(ulong)uVar1), iVar5 == 0)) {
            if ((uVar4 & 1) == 0) {
              return iVar11;
            }
            pcVar7 = strchr(__s + iVar3,0x2f);
            if (pcVar7 == (char *)0x0) {
              return iVar11;
            }
            if ((long)(int)(iVar10 - (iVar3 + uVar1)) <= (long)pcVar7 - (long)(__s + iVar3)) {
              return iVar11;
            }
          }
        }
        pIVar12 = pIVar12 + 1;
      } while (uVar2 != uVar8);
    }
    this->findNextIndex = -1;
  }
  return -1;
}

Assistant:

int32_t
Package::findNextItem() {
    const char *name, *middle, *treeSep;
    int32_t idx, nameLength, middleLength;

    if(findNextIndex<0) {
        return -1;
    }

    while(findNextIndex<itemCount) {
        idx=findNextIndex++;
        name=items[idx].name;
        nameLength=(int32_t)strlen(name);
        if(nameLength<(findPrefixLength+findSuffixLength)) {
            // item name too short for prefix & suffix
            continue;
        }
        if(findPrefixLength>0 && 0!=memcmp(findPrefix, name, findPrefixLength)) {
            // left the range of names with this prefix
            break;
        }
        middle=name+findPrefixLength;
        middleLength=nameLength-findPrefixLength-findSuffixLength;
        if(findSuffixLength>0 && 0!=memcmp(findSuffix, name+(nameLength-findSuffixLength), findSuffixLength)) {
            // suffix does not match
            continue;
        }
        // prefix & suffix match

        if(matchMode&MATCH_NOSLASH) {
            treeSep=strchr(middle, U_TREE_ENTRY_SEP_CHAR);
            if(treeSep!=NULL && (treeSep-middle)<middleLength) {
                // the middle (matching the * wildcard) contains a tree separator /
                continue;
            }
        }

        // found a matching item
        return idx;
    }

    // no more items
    findNextIndex=-1;
    return -1;
}